

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolInfo.cpp
# Opt level: O0

void __thiscall ClassInfo::Print(ClassInfo *this,ofstream *out)

{
  bool bVar1;
  ostream *poVar2;
  element_type *this_00;
  reference ppVar3;
  element_type *this_01;
  undefined1 local_60 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>
  elem;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>_>
  *__range1;
  ofstream *out_local;
  ClassInfo *this_local;
  
  poVar2 = std::operator<<((ostream *)out,"\t");
  poVar2 = std::operator<<(poVar2,"name: ");
  poVar2 = std::operator<<(poVar2,(string *)this);
  std::operator<<(poVar2,"\n");
  bVar1 = std::operator!=(&this->baseClass,"");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)out,"\t");
    poVar2 = std::operator<<(poVar2,"base: ");
    poVar2 = std::operator<<(poVar2,(string *)&this->baseClass);
    std::operator<<(poVar2,"\n");
  }
  poVar2 = std::operator<<((ostream *)out,"\t");
  poVar2 = std::operator<<(poVar2,"fields: {");
  std::operator<<(poVar2,"\n");
  this_00 = std::__shared_ptr_access<VariablesInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<VariablesInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->fields);
  VariablesInfo::Print(this_00,out);
  poVar2 = std::operator<<((ostream *)out,"\t");
  poVar2 = std::operator<<(poVar2,"} ");
  std::operator<<(poVar2,"\n");
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>_>
           ::begin(&this->methods);
  elem.second.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>_>
       ::end(&this->methods);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_true>
                              *)&elem.second.
                                 super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount), bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_false,_true>
             ::operator*(&__end1);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>
            *)local_60,ppVar3);
    poVar2 = std::operator<<((ostream *)out,"\t");
    poVar2 = std::operator<<(poVar2,"method: {");
    std::operator<<(poVar2,"\n");
    this_01 = std::__shared_ptr_access<MethodInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<MethodInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&elem.field_0x18);
    MethodInfo::Print(this_01,out);
    poVar2 = std::operator<<((ostream *)out,"\t");
    poVar2 = std::operator<<(poVar2,"} ");
    std::operator<<(poVar2,"\n");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>
             *)local_60);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_false,_true>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ClassInfo::Print( std::ofstream& out )
{
	out << "\t" << "name: " << name << "\n";
	if( baseClass != "" ) {
		out << "\t" << "base: " << baseClass << "\n";
	}
	out << "\t" << "fields: {" << "\n";
	fields->Print( out );
	out << "\t" << "} " << "\n";
	for( auto elem : methods ) {
		out << "\t" << "method: {" << "\n";
		(elem.second)->Print( out );
		out << "\t" << "} " << "\n";
	}
}